

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,_1,1,false>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                  *eval,scalar_sum_op<float,_float> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                 *xpr)

{
  float *pfVar1;
  float *pfVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  uVar3 = (xpr->m_xpr).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
          .m_rows.m_value;
  uVar6 = uVar3;
  uVar5 = uVar3;
  if ((long)uVar3 < 0) {
    uVar6 = uVar3 + 3;
    uVar5 = uVar3 + 7;
  }
  pfVar4 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
           .m_d.argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
           .
           super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
           .m_data;
  if (uVar3 + 3 < 7) {
    fVar8 = *pfVar4 * *pfVar4;
    if (1 < (long)uVar3) {
      uVar5 = 1;
      do {
        fVar8 = fVar8 + pfVar4[uVar5] * pfVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
  }
  else {
    uVar6 = uVar6 & 0xfffffffffffffffc;
    fVar8 = *pfVar4 * *pfVar4;
    fVar9 = pfVar4[1] * pfVar4[1];
    fVar10 = pfVar4[2] * pfVar4[2];
    fVar11 = pfVar4[3] * pfVar4[3];
    if (7 < (long)uVar3) {
      uVar5 = uVar5 & 0xfffffffffffffff8;
      fVar12 = pfVar4[4] * pfVar4[4];
      fVar13 = pfVar4[5] * pfVar4[5];
      fVar14 = pfVar4[6] * pfVar4[6];
      fVar15 = pfVar4[7] * pfVar4[7];
      if (0xf < uVar3) {
        lVar7 = 8;
        do {
          pfVar1 = pfVar4 + lVar7;
          pfVar2 = pfVar4 + lVar7 + 4;
          fVar8 = fVar8 + *pfVar1 * *pfVar1;
          fVar9 = fVar9 + pfVar1[1] * pfVar1[1];
          fVar10 = fVar10 + pfVar1[2] * pfVar1[2];
          fVar11 = fVar11 + pfVar1[3] * pfVar1[3];
          fVar12 = fVar12 + *pfVar2 * *pfVar2;
          fVar13 = fVar13 + pfVar2[1] * pfVar2[1];
          fVar14 = fVar14 + pfVar2[2] * pfVar2[2];
          fVar15 = fVar15 + pfVar2[3] * pfVar2[3];
          lVar7 = lVar7 + 8;
        } while (lVar7 < (long)uVar5);
      }
      fVar8 = fVar12 + fVar8;
      fVar9 = fVar13 + fVar9;
      fVar10 = fVar14 + fVar10;
      fVar11 = fVar15 + fVar11;
      if ((long)uVar5 < (long)uVar6) {
        pfVar1 = pfVar4 + uVar5;
        fVar8 = fVar8 + *pfVar1 * *pfVar1;
        fVar9 = fVar9 + pfVar1[1] * pfVar1[1];
        fVar10 = fVar10 + pfVar1[2] * pfVar1[2];
        fVar11 = fVar11 + pfVar1[3] * pfVar1[3];
      }
    }
    fVar8 = fVar11 + fVar9 + fVar10 + fVar8;
    if ((long)uVar6 < (long)uVar3) {
      do {
        fVar8 = fVar8 + pfVar4[uVar6] * pfVar4[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar3 != uVar6);
    }
  }
  return fVar8;
}

Assistant:

explicit variable_if_dynamic(T value = 0) EIGEN_NO_THROW : m_value(value) {}